

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O0

void print_lines(char *buffer,size_t size,FILE *stream)

{
  void *pvVar1;
  char *end;
  char *start;
  FILE *stream_local;
  size_t size_local;
  char *buffer_local;
  
  end = buffer;
  while( true ) {
    pvVar1 = memchr(end,10,(size_t)(buffer + (size - (long)end)));
    if (pvVar1 == (void *)0x0) break;
    fputs("# ",(FILE *)stream);
    fwrite(end,1,(long)((int)pvVar1 - (int)end),(FILE *)stream);
    fputs("\n",(FILE *)stream);
    fflush((FILE *)stream);
    end = (char *)((long)pvVar1 + 1);
  }
  if (end < buffer + size) {
    fputs("# ",(FILE *)stream);
    fwrite(end,1,(long)((int)(buffer + size) - (int)end),(FILE *)stream);
    fputs("\n",(FILE *)stream);
    fflush((FILE *)stream);
  }
  return;
}

Assistant:

void print_lines(const char* buffer, size_t size, FILE* stream) {
  const char* start;
  const char* end;

  start = buffer;
  while ((end = memchr(start, '\n', &buffer[size] - start))) {
    fputs("# ", stream);
    fwrite(start, 1, (int)(end - start), stream);
    fputs("\n", stream);
    fflush(stream);
    start = end + 1;
  }

  end = &buffer[size];
  if (start < end) {
    fputs("# ", stream);
    fwrite(start, 1, (int)(end - start), stream);
    fputs("\n", stream);
    fflush(stream);
  }
}